

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O2

ze_result_t loader::zesRasGetState(zes_ras_handle_t hRas,ze_bool_t clear,zes_ras_state_t *pState)

{
  ze_result_t zVar1;
  
  if (*(code **)(*(long *)(hRas + 8) + 0xcb0) != (code *)0x0) {
    zVar1 = (**(code **)(*(long *)(hRas + 8) + 0xcb0))(*(undefined8 *)hRas,clear);
    return zVar1;
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesRasGetState(
        zes_ras_handle_t hRas,                          ///< [in] Handle for the component.
        ze_bool_t clear,                                ///< [in] Set to 1 to clear the counters of this type
        zes_ras_state_t* pState                         ///< [in,out] Breakdown of where errors have occurred
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_ras_object_t*>( hRas )->dditable;
        auto pfnGetState = dditable->zes.Ras.pfnGetState;
        if( nullptr == pfnGetState )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hRas = reinterpret_cast<zes_ras_object_t*>( hRas )->handle;

        // forward to device-driver
        result = pfnGetState( hRas, clear, pState );

        return result;
    }